

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

void __thiscall
async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
unhandled_exception(LazyPromise<std::pair<std::error_code,_unsigned_long>_> *this)

{
  variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  *this_00;
  long in_RDI;
  exception_ptr *in_stack_ffffffffffffffd8;
  
  this_00 = (variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
             *)(in_RDI + 0x18);
  std::current_exception();
  std::
  variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
  ::emplace<std::__exception_ptr::exception_ptr,std::__exception_ptr::exception_ptr>
            (this_00,in_stack_ffffffffffffffd8);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_00);
  return;
}

Assistant:

void unhandled_exception() noexcept {
        _value.template emplace<std::exception_ptr>(std::current_exception());
    }